

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O3

bool __thiscall
gui::MultilineTextBox::handleMouseWheelScroll
          (MultilineTextBox *this,Wheel wheel,float delta,Vector2f *mouseParent)

{
  bool bVar1;
  float fVar2;
  
  bVar1 = Widget::handleMouseWheelScroll(&this->super_Widget,wheel,delta,mouseParent);
  if (!bVar1) {
    bVar1 = sf::Keyboard::isKeyPressed(LShift);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = sf::Keyboard::isKeyPressed(RShift);
      bVar1 = !bVar1;
    }
    fVar2 = roundf(delta);
    updateScroll(this,bVar1,(int)fVar2 * 3,false);
  }
  return true;
}

Assistant:

bool MultilineTextBox::handleMouseWheelScroll(sf::Mouse::Wheel wheel, float delta, const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseWheelScroll(wheel, delta, mouseParent)) {
        return true;
    }
    const bool shiftKeyPressed = sf::Keyboard::isKeyPressed(sf::Keyboard::LShift) || sf::Keyboard::isKeyPressed(sf::Keyboard::RShift);
    updateScroll(!shiftKeyPressed, static_cast<int>(std::round(delta)) * 3, false);
    return true;
}